

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O0

uint8_t char_bit_count(uint8_t i,uint8_t length)

{
  byte local_a;
  uchar local_9;
  uint8_t length_local;
  uint8_t i_local;
  
  if (i == '\0') {
    local_9 = '\0';
  }
  else if (length == '\0') {
    local_9 = '\0';
  }
  else {
    local_a = i;
    if (length != '\b') {
      local_a = i & ""[length];
    }
    local_9 = ""[local_a];
  }
  return local_9;
}

Assistant:

uint8_t char_bit_count(uint8_t i, uint8_t length) {
    //if i == 0 return 0
    if (i == 0) {
        return 0;
    }

    //cut bitmask counter
    switch (length) {
        case 8:
            break;
        case 0:
            return 0;
        default:
            i &= precount_mask[length]; //replacement for bitmask count (2 << counter - 1) - 1
    }

    return precount[i];
}